

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::SegmentBTree::SwapSegment
          (SegmentBTree *this,uint32 originalKey,SparseArraySegmentBase *oldSeg,
          SparseArraySegmentBase *newSeg)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase **ppSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  SegmentBTree *pSVar7;
  uint uVar8;
  ulong uVar9;
  uint32 itemIndex;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    uVar9 = 0;
    while (uVar8 = (uint)uVar9, uVar8 < this->segmentCount) {
      uVar5 = (this->keys).ptr[uVar9];
      pSVar1 = (this->segments).ptr[uVar9];
      if ((uVar5 != pSVar1->left) && (pSVar1 != newSeg || oldSeg != newSeg)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0xd7,
                                    "(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]))"
                                    ,
                                    "keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i])"
                                   );
        if (!bVar4) goto LAB_00a3eb7e;
        *puVar6 = 0;
        uVar5 = (this->keys).ptr[uVar9];
      }
      if (originalKey < uVar5) break;
      uVar9 = (ulong)(uVar8 + 1);
    }
    if (uVar8 != 0) {
      ppSVar2 = (this->segments).ptr;
      uVar8 = uVar8 - 1;
      if (ppSVar2[uVar8] == oldSeg) {
        ppSVar2[uVar8] = newSeg;
        (this->keys).ptr[uVar8] = newSeg->left;
        return;
      }
    }
    pSVar7 = (this->children).ptr;
    if (pSVar7 == (SegmentBTree *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0xea,"(!IsLeaf())","!IsLeaf()");
      if (!bVar4) {
LAB_00a3eb7e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      pSVar7 = (this->children).ptr;
    }
    this = pSVar7 + uVar9;
  } while( true );
}

Assistant:

void SegmentBTree::SwapSegment(uint32 originalKey, SparseArraySegmentBase* oldSeg, SparseArraySegmentBase* newSeg)
    {
        // Find old segment
        uint32 itemIndex = originalKey;
        uint32 i = 0;

        for(; i < segmentCount; i++)
        {
            Assert(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]));
            if (itemIndex <  keys[i])
            {
                break;
            }
        }

        // i is 1 past any match

        if (i > 0)
        {
            if (oldSeg == segments[i-1])
            {
                segments[i-1] = newSeg;
                keys[i-1] = newSeg->left;
                return;
            }
        }

        Assert(!IsLeaf());
        children[i].SwapSegment(originalKey, oldSeg, newSeg);
    }